

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

void __thiscall r_exec::CTPX::store_input(CTPX *this,View *input)

{
  atomic_int_fast64_t *paVar1;
  Code *object;
  BindingMap *this_00;
  Code *abstraction;
  Input i;
  Input local_48;
  
  object = (Code *)(input->super_View).object.object;
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  abstraction = BindingMap::abstract_object(this_00,object,false);
  Input::Input(&local_48,input,(_Fact *)abstraction,this_00);
  r_code::list<r_exec::Input>::push_front(&(this->super__TPX).inputs,&local_48);
  if (object == (Code *)(this->super__TPX).super_TPX.target.object) {
    this->stored_premise = true;
  }
  if (local_48.input.object != (_Object *)0x0) {
    LOCK();
    ((local_48.input.object)->refCount).super___atomic_base<long>._M_i =
         ((local_48.input.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_48.input.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(local_48.input.object)->_vptr__Object[1])();
    }
  }
  if (local_48.abstraction.object != (_Object *)0x0) {
    LOCK();
    ((local_48.abstraction.object)->refCount).super___atomic_base<long>._M_i =
         ((local_48.abstraction.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_48.abstraction.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(local_48.abstraction.object)->_vptr__Object[1])();
    }
  }
  if (local_48.bindings.object != (_Object *)0x0) {
    LOCK();
    ((local_48.bindings.object)->refCount).super___atomic_base<long>._M_i =
         ((local_48.bindings.object)->refCount).super___atomic_base<long>._M_i + -1;
    UNLOCK();
    if (((local_48.bindings.object)->refCount).super___atomic_base<long>._M_i < 1) {
      (*(local_48.bindings.object)->_vptr__Object[1])();
    }
  }
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  if ((this_00->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
    (*(this_00->super__Object)._vptr__Object[1])(this_00);
  }
  return;
}

Assistant:

void CTPX::store_input(r_exec::View *input)
{
    _Fact *input_object = (_Fact *)input->object;
    P<BindingMap> bm = new BindingMap();
    _Fact *abstracted_input = (_Fact *)bm->abstract_object(input_object, false);
    Input i(input, abstracted_input, bm);
    inputs.push_front(i);

    if (input_object == target) {
        stored_premise = true;
    }
}